

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void burgalg(double *x,int N,int p,double *phi,double *var)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *__ptr;
  void *__ptr_00;
  undefined8 *__ptr_01;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  lVar3 = (long)N;
  __ptr = (double *)malloc(lVar3 * 8);
  __ptr_00 = malloc(lVar3 * 8);
  __ptr_01 = (undefined8 *)malloc((long)p * 8 + 8);
  uVar6 = 0;
  uVar4 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    dVar11 = x[uVar6];
    *(double *)((long)__ptr_00 + uVar6 * 8) = dVar11;
    __ptr[uVar6] = dVar11;
  }
  for (lVar7 = 0; lVar7 <= p; lVar7 = lVar7 + 1) {
    __ptr_01[lVar7] = 0;
  }
  *__ptr_01 = 0x3ff0000000000000;
  dVar11 = 0.0;
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    dVar12 = __ptr[uVar6];
    dVar11 = dVar11 + (dVar12 + dVar12) * dVar12;
  }
  dVar12 = *(double *)((long)__ptr_00 + lVar3 * 8 + -8);
  uVar6 = 0;
  uVar4 = (ulong)(uint)p;
  if (p < 1) {
    uVar4 = uVar6;
  }
  dVar11 = dVar11 - (*__ptr * *__ptr + dVar12 * dVar12);
  lVar7 = 1;
  pdVar5 = __ptr;
  while (pdVar5 = pdVar5 + 1, uVar6 != uVar4) {
    lVar8 = (lVar3 + -1) - uVar6;
    dVar12 = 0.0;
    for (lVar9 = 0; lVar9 < lVar8; lVar9 = lVar9 + 1) {
      dVar12 = dVar12 + pdVar5[lVar9] * *(double *)((long)__ptr_00 + lVar9 * 8);
    }
    dVar12 = (dVar12 * -2.0) / dVar11;
    uVar6 = uVar6 + 1;
    lVar9 = lVar7;
    for (uVar10 = 0; uVar10 <= (uVar6 >> 1 & 0x7fffffff); uVar10 = uVar10 + 1) {
      dVar1 = (double)__ptr_01[uVar10];
      dVar2 = (double)__ptr_01[lVar9];
      __ptr_01[uVar10] = dVar12 * dVar2 + dVar1;
      __ptr_01[lVar9] = dVar1 * dVar12 + dVar2;
      lVar9 = lVar9 + -1;
    }
    for (lVar9 = 0; lVar9 < lVar8; lVar9 = lVar9 + 1) {
      dVar1 = pdVar5[lVar9];
      dVar2 = *(double *)((long)__ptr_00 + lVar9 * 8);
      pdVar5[lVar9] = dVar12 * dVar2 + dVar1;
      *(double *)((long)__ptr_00 + lVar9 * 8) = dVar1 * dVar12 + dVar2;
    }
    dVar12 = dVar11 * (1.0 - dVar12 * dVar12);
    dVar11 = *(double *)((long)__ptr_00 + lVar8 * 8 + -8);
    dVar11 = (dVar12 - __ptr[uVar6] * __ptr[uVar6]) - dVar11 * dVar11;
    *var = dVar12 / (double)((int)lVar8 * 2);
    lVar7 = lVar7 + 1;
  }
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    phi[uVar6] = -(double)__ptr_01[uVar6 + 1];
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void burgalg(double *x, int N, int p, double *phi,double *var) {
	int i, j, N1, p1;
	double dk,u,temp1,temp2;
	double *fk, *bk, *an;

	/*
	This code is the C translation of Cedrick Collomb's C++ Implemnetation of Burg's Algorithm
	with some minor modifications
	A tutorial on linear prediction and the Burg method.
	http://www.emptyloop.com/technotes/
	*/

	N1 = N;
	N = N - 1;
	p1 = p + 1;
	fk = (double*)malloc(sizeof(double) * N1);
	bk = (double*)malloc(sizeof(double)* N1);
	an = (double*)malloc(sizeof(double)* p1);

	for (i = 0; i < N1; ++i) {
		fk[i] = bk[i] = x[i];
	}

	for (i = 0; i < p1; ++i) {
		an[i] = 0.0;
		//printf("%g ", an[i]);
	}

	an[0] = 1.0;

	dk = 0.0;

	for (i = 0; i < N1; ++i) {
		dk += ( 2.0 * fk[i] * fk[i]);
	}

	dk -= (fk[0] * fk[0] + bk[N] * bk[N]);

	for (i = 0; i < p; ++i) {
		u = 0.0;
		for (j = 0; j <= N - i - 1; ++j) {
			u += (fk[i + j + 1] * bk[j]);
		}

		u = -2.0 * u / dk;
		 
		for (j = 0; j <= (i + 1) / 2; ++j) {
			temp1 = an[j] + u * an[i + 1 - j];
			temp2 = an[i + 1 - j] + u * an[j];
			an[j] = temp1;
			an[i + 1 - j] = temp2;
		}

		for (j = 0; j <= N - i - 1; ++j) {
			temp1 = fk[i + j + 1] + u * bk[j];
			temp2 = bk[j] + u * fk[i + j + 1];
			fk[i + j + 1] = temp1;
			bk[j] = temp2;
		}
		*var = (1.0 - u*u) * dk;
		dk = *var - fk[i + 1] * fk[i + 1] - bk[N - i - 1] * bk[N - i - 1];
		*var = *var / (2 * (N - i));

	}

	for (i = 0; i < p; ++i) {
		phi[i] = -1.0 * an[i+1];
	}

	free(fk);
	free(bk);
	free(an);
}